

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O2

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,weekday wd)

{
  ostream *poVar1;
  
  if (wd < (sunday|tuesday)) {
    poVar1 = std::operator<<(os,&DAT_0010203c + *(int *)(&DAT_0010203c + (ulong)wd * 4));
    return poVar1;
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, weekday wd) {
  switch (wd) {
    case weekday::monday:
      return os << "Monday";
    case weekday::tuesday:
      return os << "Tuesday";
    case weekday::wednesday:
      return os << "Wednesday";
    case weekday::thursday:
      return os << "Thursday";
    case weekday::friday:
      return os << "Friday";
    case weekday::saturday:
      return os << "Saturday";
    case weekday::sunday:
      return os << "Sunday";
  }
  return os;  // Should never get here, but -Wreturn-type may warn without this.
}